

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcher.cpp
# Opt level: O3

WatchID __thiscall
efsw::FileWatcher::addWatch
          (FileWatcher *this,string *directory,FileWatchListener *watcher,bool recursive,
          vector<efsw::WatcherOption,_std::allocator<efsw::WatcherOption>_> *options)

{
  pointer pcVar1;
  bool bVar2;
  Error EVar3;
  int iVar4;
  undefined4 extraout_var;
  FileWatcherImpl *pFVar5;
  string local_48;
  
  pFVar5 = this->mImpl;
  if (pFVar5->mIsGeneric == false) {
    bVar2 = FileSystem::isRemoteFS(directory);
    if (bVar2) {
      pcVar1 = (directory->_M_dataplus)._M_p;
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_48,pcVar1,pcVar1 + directory->_M_string_length);
      EVar3 = Errors::Log::createLastError(FileRemote,&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p);
      }
      return (long)EVar3;
    }
    pFVar5 = this->mImpl;
  }
  iVar4 = (*pFVar5->_vptr_FileWatcherImpl[2])(pFVar5,directory,watcher,(ulong)recursive,options);
  return CONCAT44(extraout_var,iVar4);
}

Assistant:

WatchID FileWatcher::addWatch( const std::string& directory, FileWatchListener* watcher,
							   bool recursive, const std::vector<WatcherOption>& options ) {
	if ( mImpl->mIsGeneric || !FileSystem::isRemoteFS( directory ) ) {
		return mImpl->addWatch( directory, watcher, recursive, options );
	} else {
		return Errors::Log::createLastError( Errors::FileRemote, directory );
	}
}